

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O0

void net_select_result(int fd,int event)

{
  Plug *pPVar1;
  size_t sVar2;
  accept_ctx_t ctx;
  _Bool _Var3;
  int iVar4;
  ssize_t sVar5;
  int *piVar6;
  char *pcVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t __n;
  _Bool local_5759;
  size_t bufsize_after;
  size_t bufsize_before;
  SockAddr thisaddr_1;
  undefined1 local_52f0 [8];
  SockAddr thisaddr;
  char *errmsg;
  socklen_t errlen;
  int err;
  int atmark_from_ioctl;
  int t;
  accept_ctx_t actx;
  undefined1 local_50a8 [4];
  socklen_t addrlen;
  sockaddr_union su;
  NetSocket *pNStack_5020;
  _Bool atmark;
  NetSocket *s;
  char buf [20480];
  int ret;
  int event_local;
  int fd_local;
  
  su.storage.__ss_align._7_1_ = 1;
  ret = fd;
  pNStack_5020 = (NetSocket *)find234(sktree,&ret,cmpforsearch);
  if (pNStack_5020 != (NetSocket *)0x0) {
    noise_ultralight(NOISE_SOURCE_IOID,(long)ret);
    if (event == 1) {
      if ((pNStack_5020->listener & 1U) == 0) {
        if ((pNStack_5020->frozen & 1U) == 0) {
          if (((pNStack_5020->oobinline & 1U) == 0) || ((pNStack_5020->oobpending & 1U) == 0)) {
            su.storage.__ss_align._7_1_ = 1;
          }
          else {
            iVar4 = ioctl(pNStack_5020->s,0x8905,&errlen);
            if ((iVar4 == 0) &&
               (su.storage.__ss_align._7_1_ = errlen != 0, (bool)su.storage.__ss_align._7_1_)) {
              pNStack_5020->oobpending = false;
            }
          }
          __n = 0x5000;
          if ((pNStack_5020->oobpending & 1U) != 0) {
            __n = 1;
          }
          sVar5 = recv(pNStack_5020->s,&s,__n,0);
          buf._20476_4_ = (undefined4)sVar5;
          noise_ultralight(NOISE_SOURCE_IOLEN,(long)(int)buf._20476_4_);
          if ((-1 < (int)buf._20476_4_) || (piVar6 = __errno_location(), *piVar6 != 0xb)) {
            if ((int)buf._20476_4_ < 0) {
              pPVar1 = pNStack_5020->plug;
              piVar6 = __errno_location();
              plug_closing_errno(pPVar1,*piVar6);
            }
            else if (buf._20476_4_ == 0) {
              pNStack_5020->incomingeof = true;
              uxsel_tell(pNStack_5020);
              plug_closing_normal(pNStack_5020->plug);
            }
            else {
              if (pNStack_5020->addr != (SockAddr *)0x0) {
                sk_addr_free(pNStack_5020->addr);
                pNStack_5020->addr = (SockAddr *)0x0;
              }
              plug_receive(pNStack_5020->plug,(uint)((su.storage.__ss_align._7_1_ & 1) == 0),
                           (char *)&s,(long)(int)buf._20476_4_);
            }
          }
        }
      }
      else {
        actx._4_4_ = 0x80;
        memset(local_50a8,0,0x80);
        err = accept(pNStack_5020->s,(sockaddr *)local_50a8,(socklen_t *)((long)&actx + 4));
        if (-1 < err) {
          nonblock(err);
          atmark_from_ioctl = err;
          if ((((pNStack_5020->addr != (SockAddr *)0x0) && (pNStack_5020->addr->superfamily == UNIX)
               ) || ((pNStack_5020->localhost_only & 1U) == 0)) ||
             (_Var3 = sockaddr_is_loopback((sockaddr *)local_50a8), _Var3)) {
            ctx._4_4_ = t;
            ctx.i = atmark_from_ioctl;
            iVar4 = plug_accepting(pNStack_5020->plug,sk_net_accept,ctx);
            if (iVar4 != 0) {
              close(err);
            }
          }
          else {
            close(err);
          }
        }
      }
    }
    else if (event == 2) {
      if ((pNStack_5020->connected & 1U) == 0) {
        errmsg._0_4_ = 4;
        thisaddr.hostname[0x1f8] = '\0';
        thisaddr.hostname[0x1f9] = '\0';
        thisaddr.hostname[0x1fa] = '\0';
        thisaddr.hostname[0x1fb] = '\0';
        thisaddr.hostname[0x1fc] = '\0';
        thisaddr.hostname[0x1fd] = '\0';
        thisaddr.hostname[0x1fe] = '\0';
        thisaddr.hostname[0x1ff] = '\0';
        iVar4 = getsockopt(pNStack_5020->s,1,4,(void *)((long)&errmsg + 4),(socklen_t *)&errmsg);
        if (iVar4 < 0) {
          piVar6 = __errno_location();
          pcVar7 = strerror(*piVar6);
          thisaddr.hostname._504_8_ = dupprintf("getsockopt(SO_ERROR): %s",pcVar7);
          piVar6 = __errno_location();
          errmsg._4_4_ = *piVar6;
        }
        else if (errmsg._4_4_ != 0) {
          pcVar7 = strerror(errmsg._4_4_);
          thisaddr.hostname._504_8_ = dupstr(pcVar7);
        }
        if (thisaddr.hostname._504_8_ == 0) {
          sk_extractaddr_tmp((SockAddr *)&bufsize_before,pNStack_5020->addr,&pNStack_5020->step);
          plug_log(pNStack_5020->plug,2,(SockAddr *)&bufsize_before,pNStack_5020->port,(char *)0x0,0
                  );
        }
        else {
          if (pNStack_5020->addr == (SockAddr *)0x0) {
            __assert_fail("s->addr",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/network.c"
                          ,0x591,"void net_select_result(int, int)");
          }
          sk_extractaddr_tmp((SockAddr *)(thisaddr_1.hostname + 0x1f8),pNStack_5020->addr,
                             &pNStack_5020->step);
          memcpy(local_52f0,thisaddr_1.hostname + 0x1f8,0x220);
          plug_log(pNStack_5020->plug,1,(SockAddr *)local_52f0,pNStack_5020->port,
                   (char *)thisaddr.hostname._504_8_,errmsg._4_4_);
          while( true ) {
            local_5759 = false;
            if ((errmsg._4_4_ != 0) && (local_5759 = false, pNStack_5020->addr != (SockAddr *)0x0))
            {
              local_5759 = sk_nextaddr(pNStack_5020->addr,&pNStack_5020->step);
            }
            if (local_5759 == false) break;
            errmsg._4_4_ = try_connect(pNStack_5020);
          }
          if (errmsg._4_4_ != 0) {
            plug_closing_errno(pNStack_5020->plug,errmsg._4_4_);
            return;
          }
          if ((pNStack_5020->connected & 1U) == 0) {
            return;
          }
        }
        if (pNStack_5020->addr != (SockAddr *)0x0) {
          sk_addr_free(pNStack_5020->addr);
          pNStack_5020->addr = (SockAddr *)0x0;
        }
        pNStack_5020->connected = true;
        pNStack_5020->writable = true;
        uxsel_tell(pNStack_5020);
      }
      else {
        pNStack_5020->writable = true;
        sVar2 = pNStack_5020->sending_oob;
        sVar8 = bufchain_size(&pNStack_5020->output_data);
        try_send(pNStack_5020);
        sVar10 = pNStack_5020->sending_oob;
        sVar9 = bufchain_size(&pNStack_5020->output_data);
        sVar10 = sVar10 + sVar9;
        if (sVar10 < sVar2 + sVar8) {
          plug_sent(pNStack_5020->plug,sVar10);
        }
      }
    }
    else if (event == 4) {
      if ((pNStack_5020->oobinline & 1U) == 0) {
        sVar5 = recv(pNStack_5020->s,&s,0x5000,1);
        buf._20476_4_ = (undefined4)sVar5;
        noise_ultralight(NOISE_SOURCE_IOLEN,(long)(int)buf._20476_4_);
        if (buf._20476_4_ == 0) {
          plug_closing_error(pNStack_5020->plug,"Internal networking trouble");
        }
        else if ((int)buf._20476_4_ < 0) {
          pPVar1 = pNStack_5020->plug;
          piVar6 = __errno_location();
          plug_closing_errno(pPVar1,*piVar6);
        }
        else {
          if (pNStack_5020->addr != (SockAddr *)0x0) {
            sk_addr_free(pNStack_5020->addr);
            pNStack_5020->addr = (SockAddr *)0x0;
          }
          plug_receive(pNStack_5020->plug,2,(char *)&s,(long)(int)buf._20476_4_);
        }
      }
      else {
        pNStack_5020->oobpending = true;
      }
    }
  }
  return;
}

Assistant:

static void net_select_result(int fd, int event)
{
    int ret;
    char buf[20480];                   /* nice big buffer for plenty of speed */
    NetSocket *s;
    bool atmark = true;

    /* Find the Socket structure */
    s = find234(sktree, &fd, cmpforsearch);
    if (!s)
        return;                /* boggle */

    noise_ultralight(NOISE_SOURCE_IOID, fd);

    switch (event) {
      case SELECT_X:                   /* exceptional */
        if (!s->oobinline) {
            /*
             * On a non-oobinline socket, this indicates that we
             * can immediately perform an OOB read and get back OOB
             * data, which we will send to the back end with
             * type==2 (urgent data).
             */
            ret = recv(s->s, buf, sizeof(buf), MSG_OOB);
            noise_ultralight(NOISE_SOURCE_IOLEN, ret);
            if (ret == 0) {
                plug_closing_error(s->plug, "Internal networking trouble");
            } else if (ret < 0) {
                plug_closing_errno(s->plug, errno);
            } else {
                /*
                 * Receiving actual data on a socket means we can
                 * stop falling back through the candidate
                 * addresses to connect to.
                 */
                if (s->addr) {
                    sk_addr_free(s->addr);
                    s->addr = NULL;
                }
                plug_receive(s->plug, 2, buf, ret);
            }
            break;
        }

        /*
         * If we reach here, this is an oobinline socket, which
         * means we should set s->oobpending and then deal with it
         * when we get called for the readability event (which
         * should also occur).
         */
        s->oobpending = true;
        break;
      case SELECT_R:                   /* readable; also acceptance */
        if (s->listener) {
            /*
             * On a listening socket, the readability event means a
             * connection is ready to be accepted.
             */
            union sockaddr_union su;
            socklen_t addrlen = sizeof(su);
            accept_ctx_t actx;
            int t;  /* socket of connection */

            memset(&su, 0, addrlen);
            t = accept(s->s, &su.sa, &addrlen);
            if (t < 0) {
                break;
            }

            nonblock(t);
            actx.i = t;

            if ((!s->addr || s->addr->superfamily != UNIX) &&
                s->localhost_only && !sockaddr_is_loopback(&su.sa)) {
                close(t);              /* someone let nonlocal through?! */
            } else if (plug_accepting(s->plug, sk_net_accept, actx)) {
                close(t);              /* denied or error */
            }
            break;
        }

        /*
         * If we reach here, this is not a listening socket, so
         * readability really means readability.
         */

        /* In the case the socket is still frozen, we don't even bother */
        if (s->frozen)
            break;

        /*
         * We have received data on the socket. For an oobinline
         * socket, this might be data _before_ an urgent pointer,
         * in which case we send it to the back end with type==1
         * (data prior to urgent).
         */
        if (s->oobinline && s->oobpending) {
            int atmark_from_ioctl;
            if (ioctl(s->s, SIOCATMARK, &atmark_from_ioctl) == 0) {
                atmark = atmark_from_ioctl;
                if (atmark)
                    s->oobpending = false; /* clear this indicator */
            }
        } else
            atmark = true;

        ret = recv(s->s, buf, s->oobpending ? 1 : sizeof(buf), 0);
        noise_ultralight(NOISE_SOURCE_IOLEN, ret);
        if (ret < 0) {
            if (errno == EWOULDBLOCK) {
                break;
            }
        }
        if (ret < 0) {
            plug_closing_errno(s->plug, errno);
        } else if (0 == ret) {
            s->incomingeof = true;     /* stop trying to read now */
            uxsel_tell(s);
            plug_closing_normal(s->plug);
        } else {
            /*
             * Receiving actual data on a socket means we can
             * stop falling back through the candidate
             * addresses to connect to.
             */
            if (s->addr) {
                sk_addr_free(s->addr);
                s->addr = NULL;
            }
            plug_receive(s->plug, atmark ? 0 : 1, buf, ret);
        }
        break;
      case SELECT_W:                   /* writable */
        if (!s->connected) {
            /*
             * select/poll reports a socket as _writable_ when an
             * asynchronous connect() attempt either completes or
             * fails. So first we must find out which.
             */
            {
                int err;
                socklen_t errlen = sizeof(err);
                char *errmsg = NULL;
                if (getsockopt(s->s, SOL_SOCKET, SO_ERROR, &err, &errlen)<0) {
                    errmsg = dupprintf("getsockopt(SO_ERROR): %s",
                                       strerror(errno));
                    err = errno;       /* got to put something in here */
                } else if (err != 0) {
                    errmsg = dupstr(strerror(err));
                }
                if (errmsg) {
                    /*
                     * The asynchronous connection attempt failed.
                     * Report the problem via plug_log, and try again
                     * with the next candidate address, if we have
                     * more than one.
                     */
                    SockAddr thisaddr;
                    assert(s->addr);

                    thisaddr = sk_extractaddr_tmp(s->addr, &s->step);
                    plug_log(s->plug, PLUGLOG_CONNECT_FAILED,
                             &thisaddr, s->port, errmsg, err);

                    while (err && s->addr && sk_nextaddr(s->addr, &s->step)) {
                        err = try_connect(s);
                    }
                    if (err) {
                        plug_closing_errno(s->plug, err);
                        return;      /* socket is now presumably defunct */
                    }
                    if (!s->connected)
                        return;      /* another async attempt in progress */
                } else {
                    /*
                     * The connection attempt succeeded.
                     */
                    SockAddr thisaddr = sk_extractaddr_tmp(s->addr, &s->step);
                    plug_log(s->plug, PLUGLOG_CONNECT_SUCCESS,
                             &thisaddr, s->port, NULL, 0);
                }
            }

            /*
             * If we get here, we've managed to make a connection.
             */
            if (s->addr) {
                sk_addr_free(s->addr);
                s->addr = NULL;
            }
            s->connected = true;
            s->writable = true;
            uxsel_tell(s);
        } else {
            size_t bufsize_before, bufsize_after;
            s->writable = true;
            bufsize_before = s->sending_oob + bufchain_size(&s->output_data);
            try_send(s);
            bufsize_after = s->sending_oob + bufchain_size(&s->output_data);
            if (bufsize_after < bufsize_before)
                plug_sent(s->plug, bufsize_after);
        }
        break;
    }
}